

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::bb::(anonymous_namespace)::getShaderName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,BufferBlock *block,
          int instanceNdx,BufferVar *var,TypeComponentVector *accessPath)

{
  bool bVar1;
  char *pcVar2;
  pointer pVVar3;
  VarType *this_00;
  const_iterator type;
  StructType *this_01;
  ostream *poVar4;
  StructMember *this_02;
  undefined4 in_register_0000000c;
  __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  end;
  StructType *structPtr;
  undefined1 local_1e0 [8];
  VarType curType;
  __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  local_1c0;
  const_iterator pathComp;
  ostringstream local_1a8 [8];
  ostringstream name;
  TypeComponentVector *accessPath_local;
  BufferVar *var_local;
  int instanceNdx_local;
  BufferBlock *block_local;
  
  end._M_current = (VarTypeComponent *)var;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pcVar2 = BufferBlock::getInstanceName((BufferBlock *)this);
  if (pcVar2 != (char *)0x0) {
    pcVar2 = BufferBlock::getInstanceName((BufferBlock *)this);
    std::operator<<((ostream *)local_1a8,pcVar2);
    bVar1 = BufferBlock::isArray((BufferBlock *)this);
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)local_1a8,"[");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)block);
      std::operator<<(poVar4,"]");
    }
    std::operator<<((ostream *)local_1a8,".");
  }
  pcVar2 = BufferVar::getName((BufferVar *)CONCAT44(in_register_0000000c,instanceNdx));
  std::operator<<((ostream *)local_1a8,pcVar2);
  local_1c0._M_current =
       (VarTypeComponent *)
       std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::begin
                 ((vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> *)var);
  while( true ) {
    curType.m_data._8_8_ =
         std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::end
                   ((vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> *)var);
    bVar1 = __gnu_cxx::operator!=
                      (&local_1c0,
                       (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                        *)((long)&curType.m_data + 8));
    if (!bVar1) break;
    pVVar3 = __gnu_cxx::
             __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
             ::operator->(&local_1c0);
    if (pVVar3->type == STRUCT_MEMBER) {
      this_00 = BufferVar::getType((BufferVar *)CONCAT44(in_register_0000000c,instanceNdx));
      type = std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::begin
                       ((vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_> *)var
                       );
      glu::
      getVarType<__gnu_cxx::__normal_iterator<glu::VarTypeComponent_const*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
                ((VarType *)local_1e0,(glu *)this_00,(VarType *)type._M_current,local_1c0,end);
      this_01 = glu::VarType::getStructPtr((VarType *)local_1e0);
      poVar4 = std::operator<<((ostream *)local_1a8,".");
      pVVar3 = __gnu_cxx::
               __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
               ::operator->(&local_1c0);
      this_02 = glu::StructType::getMember(this_01,pVVar3->index);
      pcVar2 = glu::StructMember::getName(this_02);
      std::operator<<(poVar4,pcVar2);
      glu::VarType::~VarType((VarType *)local_1e0);
    }
    else {
      pVVar3 = __gnu_cxx::
               __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
               ::operator->(&local_1c0);
      if (pVVar3->type == ARRAY_ELEMENT) {
        poVar4 = std::operator<<((ostream *)local_1a8,"[");
        pVVar3 = __gnu_cxx::
                 __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                 ::operator->(&local_1c0);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,pVVar3->index);
        std::operator<<(poVar4,"]");
      }
    }
    __gnu_cxx::
    __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
    ::operator++(&local_1c0,0);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string getShaderName (const BufferBlock& block, int instanceNdx, const BufferVar& var, const glu::TypeComponentVector& accessPath)
{
	std::ostringstream name;

	if (block.getInstanceName())
	{
		name << block.getInstanceName();

		if (block.isArray())
			name << "[" << instanceNdx << "]";

		name << ".";
	}
	else
		DE_ASSERT(instanceNdx == 0);

	name << var.getName();

	for (glu::TypeComponentVector::const_iterator pathComp = accessPath.begin(); pathComp != accessPath.end(); pathComp++)
	{
		if (pathComp->type == glu::VarTypeComponent::STRUCT_MEMBER)
		{
			const VarType		curType		= glu::getVarType(var.getType(), accessPath.begin(), pathComp);
			const StructType*	structPtr	= curType.getStructPtr();

			name << "." << structPtr->getMember(pathComp->index).getName();
		}
		else if (pathComp->type == glu::VarTypeComponent::ARRAY_ELEMENT)
			name << "[" << pathComp->index << "]";
		else
			DE_ASSERT(false);
	}

	return name.str();
}